

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_req_handler.c
# Opt level: O1

_Bool uo_http_req_handler_try
                (uo_http_req_handler *http_req_handler,char *method_sp_uri,uo_strhashtbl *params,
                uo_refstack *refstack)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *key;
  long lVar4;
  uo_strhashtbl *hashtbl;
  long lVar5;
  size_t sVar6;
  uo_refcount *puVar7;
  void **ppvVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  bool bVar15;
  undefined8 uStack_60;
  undefined1 *local_58;
  uo_strhashtbl *local_50;
  long local_48;
  uo_http_req_handler *local_40;
  uo_refstack *local_38;
  
  pcVar13 = http_req_handler->req_pattern;
  sVar14 = http_req_handler->param_count;
  if (sVar14 == 0) {
    do {
      cVar1 = *pcVar13;
      if (cVar1 != *method_sp_uri) goto LAB_00101a00;
      pcVar13 = pcVar13 + 1;
      method_sp_uri = method_sp_uri + 1;
    } while (cVar1 != '\0');
    pcVar13 = (char *)0x0;
LAB_00101a00:
    if (pcVar13 == (char *)0x0) {
      return true;
    }
    return *pcVar13 == '*';
  }
  local_38 = refstack;
  local_50 = params;
  local_58 = (undefined1 *)&local_58;
  lVar4 = -(sVar14 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar9 = (long)&local_58 + lVar4;
  local_48 = lVar9;
  local_40 = http_req_handler;
  while (bVar15 = sVar14 != 0, sVar14 = sVar14 - 1, bVar15) {
    lVar11 = 0;
    do {
      pcVar12 = pcVar13 + lVar11;
      if (*pcVar12 != method_sp_uri[lVar11]) {
        pcVar12 = pcVar13 + lVar11;
        goto LAB_00101960;
      }
      lVar11 = lVar11 + 1;
    } while (*pcVar12 != '\0');
    pcVar12 = (char *)0x0;
LAB_00101960:
    if (*pcVar12 == '{') {
      lVar11 = sVar14 * 0x18;
      *(char **)(lVar9 + lVar11) = pcVar12 + 1;
      lVar5 = (long)pcVar12 - (long)pcVar13;
      *(char **)(lVar9 + 8 + lVar11) = method_sp_uri + lVar5;
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x101991;
      sVar6 = strlen(pcVar12);
      pcVar13 = pcVar12 + sVar6 + 1;
      cVar1 = *pcVar13;
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x1019a4;
      method_sp_uri = strchr(method_sp_uri + lVar5,(int)cVar1);
      lVar9 = local_48;
      if (method_sp_uri == (char *)0x0) {
        bVar15 = false;
        method_sp_uri = (char *)0x0;
      }
      else {
        *(char **)(local_48 + 0x10 + lVar11) = method_sp_uri;
        bVar15 = true;
      }
    }
    else {
      bVar15 = false;
    }
    if (!bVar15) {
      return false;
    }
  }
  do {
    cVar1 = *pcVar13;
    if (cVar1 != *method_sp_uri) goto LAB_00101a18;
    pcVar13 = pcVar13 + 1;
    method_sp_uri = method_sp_uri + 1;
  } while (cVar1 != '\0');
  pcVar13 = (char *)0x0;
LAB_00101a18:
  if ((pcVar13 != (char *)0x0) && (*pcVar13 != '*')) {
    return false;
  }
  sVar14 = local_40->param_count;
  local_40 = (uo_http_req_handler *)(sVar14 * 3);
  pcVar13 = *(char **)(lVar9 + -0x10 + sVar14 * 0x18);
  *(undefined8 *)((long)&uStack_60 + lVar4) = 0x101a4b;
  pcVar12 = strdup(pcVar13);
  *(undefined8 *)((long)&uStack_60 + lVar4) = 0x101a5d;
  puVar7 = uo_refcount_create(pcVar12,free);
  sVar2 = local_38->count;
  sVar3 = local_38->capacity;
  local_38->count = sVar2 + 1;
  if (sVar2 == sVar3) {
    ppvVar8 = local_38->items;
    local_38->capacity = sVar3 * 2;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x101a94;
    ppvVar8 = (void **)realloc(ppvVar8,sVar3 << 4);
    local_38->items = ppvVar8;
  }
  hashtbl = local_50;
  local_38->items[sVar2] = puVar7;
  if (sVar14 != 0) {
    plVar10 = (long *)(local_48 + (long)local_40 * 8 + -8);
    do {
      lVar9 = plVar10[-1];
      pcVar12[*plVar10 - (long)pcVar13] = '\0';
      key = (char *)plVar10[-2];
      *(undefined8 *)((long)&uStack_60 + lVar4) = 0x101ae2;
      uo_strhashtbl_set(hashtbl,key,pcVar12 + (lVar9 - (long)pcVar13));
      plVar10 = plVar10 + -3;
      sVar14 = sVar14 - 1;
    } while (sVar14 != 0);
    return true;
  }
  return true;
}

Assistant:

bool uo_http_req_handler_try(
    uo_http_req_handler *http_req_handler,
    const char *method_sp_uri,
    uo_strhashtbl *params,
    uo_refstack *refstack)
{
    char *req_pattern = http_req_handler->req_pattern;
    size_t i = http_req_handler->param_count;

    if (i == 0)
    {
        // request line is checked for exact match or prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        return !p || *p == '*';
    }

    // temporary array for pattern parameter name start, value start and value end pointers
    char *param_ptrs[i * 3];

    while (i--)
    {
        // find pattern parameter
        char *param_start = uo_strdiff(req_pattern, method_sp_uri);

        if (*param_start != '{')
            return false;

        // store pattern parameter name pointer
        param_ptrs[i * 3] = param_start + 1;

        // store matched pattern parameter value start pointer
        param_ptrs[i * 3 + 1] = (char *)(method_sp_uri += param_start - req_pattern);

        // skip pattern parameter name
        req_pattern = param_start + strlen(param_start) + 1;

        // find pattern parameter value end
        method_sp_uri = strchr(method_sp_uri, *req_pattern);

        if (!method_sp_uri)
            return false;

        // store matched pattern parameter end pointer
        param_ptrs[i * 3 + 2] = (char *)method_sp_uri;
    }

    {
        // chech if the request line end either a exact match or a prefix match
        char *p = uo_strdiff(req_pattern, method_sp_uri);
        if (p && *p != '*')
            return false;
    }

    // req_handler matches the request method and URI
    // now store the pattern parameters

    i = http_req_handler->param_count;
    char *first_param_value = param_ptrs[(i - 1) * 3 + 1];
    char *param_value_buf = strdup(first_param_value);
    uo_refstack_push(refstack, param_value_buf, free);

    while (i--)
    {
        // null terminate parameter value
        char *param_value = param_value_buf + (param_ptrs[i * 3 + 1] - first_param_value);
        param_value_buf[param_ptrs[i * 3 + 2] - first_param_value] = '\0';

        // get parameter name
        char *param_name = param_ptrs[i * 3];

        // store parameter name and value
        uo_strhashtbl_set(params, param_name, param_value);
    }

    return true;
}